

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_ssse3.c
# Opt level: O0

uint highbd_masked_sad_ssse3
               (uint8_t *src8,int src_stride,uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,
               uint8_t *m_ptr,int m_stride,int width,int height)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  __m128i data_l;
  __m128i m_inv;
  __m128i m;
  __m128i b;
  __m128i a;
  __m128i src;
  __m128i one;
  __m128i round_const;
  __m128i mask_max;
  __m128i res;
  int y;
  int x;
  uint16_t *b_ptr;
  uint16_t *a_ptr;
  uint16_t *src_ptr;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined1 local_3a8 [16];
  int local_398;
  int local_394;
  long local_390;
  long local_388;
  long local_380;
  byte local_2f8;
  byte bStack_2f7;
  byte bStack_2f6;
  byte bStack_2f5;
  byte bStack_2f4;
  byte bStack_2f3;
  byte bStack_2f2;
  byte bStack_2f1;
  int local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  int local_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int local_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  uint local_288;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_250;
  short sStack_24e;
  short sStack_24c;
  short sStack_24a;
  short local_248;
  short sStack_246;
  short sStack_244;
  short sStack_242;
  short sStack_240;
  short sStack_23e;
  short sStack_23c;
  short sStack_23a;
  ushort uStack_236;
  ushort uStack_234;
  ushort uStack_232;
  ushort uStack_22e;
  ushort uStack_22c;
  ushort uStack_22a;
  ushort uStack_204;
  undefined2 local_1f8;
  undefined2 uStack_1f6;
  undefined2 uStack_1f4;
  undefined2 uStack_1f2;
  undefined2 local_1e8;
  undefined2 uStack_1e6;
  undefined2 uStack_1e4;
  undefined2 uStack_1e2;
  ushort uStack_11c;
  undefined2 uStack_110;
  undefined2 uStack_10e;
  undefined2 uStack_10c;
  undefined2 uStack_10a;
  undefined2 uStack_100;
  undefined2 uStack_fe;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  int sad;
  __m128i diff;
  __m128i pred;
  __m128i pred_r;
  __m128i mask_r;
  __m128i data_r;
  __m128i pred_l;
  __m128i mask_l;
  
  local_380 = in_RDI * 2;
  local_388 = in_RDX * 2;
  local_390 = in_R8 * 2;
  local_3a8 = ZEXT816(0);
  for (local_398 = 0; local_398 < (int)m[0]; local_398 = local_398 + 1) {
    for (local_394 = 0; local_394 < (int)m_inv[1]; local_394 = local_394 + 8) {
      puVar1 = (undefined8 *)(local_380 + (long)local_394 * 2);
      uVar3 = *puVar1;
      uVar4 = puVar1[1];
      puVar1 = (undefined8 *)(local_388 + (long)local_394 * 2);
      uVar5 = *puVar1;
      uVar6 = puVar1[1];
      puVar1 = (undefined8 *)(local_390 + (long)local_394 * 2);
      uVar7 = *puVar1;
      uVar8 = puVar1[1];
      uVar2 = *(undefined8 *)(data_l[1] + local_394);
      local_2f8 = (byte)uVar2;
      bStack_2f7 = (byte)((ulong)uVar2 >> 8);
      bStack_2f6 = (byte)((ulong)uVar2 >> 0x10);
      bStack_2f5 = (byte)((ulong)uVar2 >> 0x18);
      bStack_2f4 = (byte)((ulong)uVar2 >> 0x20);
      bStack_2f3 = (byte)((ulong)uVar2 >> 0x28);
      bStack_2f2 = (byte)((ulong)uVar2 >> 0x30);
      bStack_2f1 = (byte)((ulong)uVar2 >> 0x38);
      uStack_236 = (ushort)bStack_2f7;
      uStack_234 = (ushort)bStack_2f6;
      uStack_232 = (ushort)bStack_2f5;
      uStack_22e = (ushort)bStack_2f3;
      uStack_22c = (ushort)bStack_2f2;
      uStack_22a = (ushort)bStack_2f1;
      local_1e8 = (undefined2)uVar5;
      uStack_1e6 = (undefined2)((ulong)uVar5 >> 0x10);
      uStack_1e4 = (undefined2)((ulong)uVar5 >> 0x20);
      uStack_1e2 = (undefined2)((ulong)uVar5 >> 0x30);
      local_1f8 = (undefined2)uVar7;
      uStack_1f6 = (undefined2)((ulong)uVar7 >> 0x10);
      uStack_1f4 = (undefined2)((ulong)uVar7 >> 0x20);
      uStack_1f2 = (undefined2)((ulong)uVar7 >> 0x30);
      auVar10[1] = 0;
      auVar10[0] = local_2f8;
      uStack_204 = CONCAT11(0,bStack_2f6);
      auVar11._2_2_ = local_1f8;
      auVar11._0_2_ = local_1e8;
      auVar11._4_2_ = uStack_1e6;
      auVar11._6_2_ = uStack_1f6;
      auVar11._10_2_ = uStack_1f4;
      auVar11._8_2_ = uStack_1e4;
      auVar11._12_2_ = uStack_1e2;
      auVar11._14_2_ = uStack_1f2;
      auVar10._2_2_ = 0x40 - (ushort)local_2f8;
      auVar10[4] = bStack_2f7;
      auVar10[5] = 0;
      auVar10._6_2_ = 0x40 - uStack_236;
      auVar10._10_2_ = 0x40 - uStack_234;
      auVar10._8_2_ = uStack_204;
      auVar10[0xc] = bStack_2f5;
      auVar10[0xd] = 0;
      auVar10._14_2_ = 0x40 - uStack_232;
      auVar15 = pmaddwd(auVar11,auVar10);
      local_298 = auVar15._0_4_;
      iStack_294 = auVar15._4_4_;
      iStack_290 = auVar15._8_4_;
      iStack_28c = auVar15._12_4_;
      auVar15 = ZEXT416(6);
      local_458 = CONCAT44(iStack_294 + 0x20 >> auVar15,local_298 + 0x20 >> auVar15);
      uStack_450._0_4_ = iStack_290 + 0x20 >> auVar15;
      uStack_450._4_4_ = iStack_28c + 0x20 >> auVar15;
      uStack_100 = (undefined2)uVar6;
      uStack_fe = (undefined2)((ulong)uVar6 >> 0x10);
      uStack_fc = (undefined2)((ulong)uVar6 >> 0x20);
      uStack_fa = (undefined2)((ulong)uVar6 >> 0x30);
      uStack_110 = (undefined2)uVar8;
      uStack_10e = (undefined2)((ulong)uVar8 >> 0x10);
      uStack_10c = (undefined2)((ulong)uVar8 >> 0x20);
      uStack_10a = (undefined2)((ulong)uVar8 >> 0x30);
      auVar16[1] = 0;
      auVar16[0] = bStack_2f4;
      uStack_11c = CONCAT11(0,bStack_2f2);
      auVar9._2_2_ = uStack_110;
      auVar9._0_2_ = uStack_100;
      auVar9._4_2_ = uStack_fe;
      auVar9._6_2_ = uStack_10e;
      auVar9._10_2_ = uStack_10c;
      auVar9._8_2_ = uStack_fc;
      auVar9._12_2_ = uStack_fa;
      auVar9._14_2_ = uStack_10a;
      auVar16._2_2_ = 0x40 - (ushort)bStack_2f4;
      auVar16[4] = bStack_2f3;
      auVar16[5] = 0;
      auVar16._6_2_ = 0x40 - uStack_22e;
      auVar16._10_2_ = 0x40 - uStack_22c;
      auVar16._8_2_ = uStack_11c;
      auVar16[0xc] = bStack_2f1;
      auVar16[0xd] = 0;
      auVar16._14_2_ = 0x40 - uStack_22a;
      auVar15 = pmaddwd(auVar9,auVar16);
      local_2b8 = auVar15._0_4_;
      iStack_2b4 = auVar15._4_4_;
      iStack_2b0 = auVar15._8_4_;
      iStack_2ac = auVar15._12_4_;
      auVar15 = ZEXT416(6);
      local_488 = CONCAT44(iStack_2b4 + 0x20 >> auVar15,local_2b8 + 0x20 >> auVar15);
      uStack_480._0_4_ = iStack_2b0 + 0x20 >> auVar15;
      uStack_480._4_4_ = iStack_2ac + 0x20 >> auVar15;
      auVar13._8_8_ = uStack_450;
      auVar13._0_8_ = local_458;
      auVar12._8_8_ = uStack_480;
      auVar12._0_8_ = local_488;
      auVar15 = packssdw(auVar13,auVar12);
      local_248 = auVar15._0_2_;
      sStack_246 = auVar15._2_2_;
      sStack_244 = auVar15._4_2_;
      sStack_242 = auVar15._6_2_;
      sStack_240 = auVar15._8_2_;
      sStack_23e = auVar15._10_2_;
      sStack_23c = auVar15._12_2_;
      sStack_23a = auVar15._14_2_;
      local_258 = (short)uVar3;
      sStack_256 = (short)((ulong)uVar3 >> 0x10);
      sStack_254 = (short)((ulong)uVar3 >> 0x20);
      sStack_252 = (short)((ulong)uVar3 >> 0x30);
      sStack_250 = (short)uVar4;
      sStack_24e = (short)((ulong)uVar4 >> 0x10);
      sStack_24c = (short)((ulong)uVar4 >> 0x20);
      sStack_24a = (short)((ulong)uVar4 >> 0x30);
      auVar14._2_2_ = sStack_246 - sStack_256;
      auVar14._0_2_ = local_248 - local_258;
      auVar14._4_2_ = sStack_244 - sStack_254;
      auVar14._6_2_ = sStack_242 - sStack_252;
      auVar14._8_2_ = sStack_240 - sStack_250;
      auVar14._10_2_ = sStack_23e - sStack_24e;
      auVar14._12_2_ = sStack_23c - sStack_24c;
      auVar14._14_2_ = sStack_23a - sStack_24a;
      auVar16 = pabsw(auVar14,auVar14);
      auVar15._8_8_ = 0x1000100010001;
      auVar15._0_8_ = 0x1000100010001;
      auVar15 = pmaddwd(auVar16,auVar15);
      local_2d8 = local_3a8._0_4_;
      iStack_2d4 = local_3a8._4_4_;
      iStack_2d0 = local_3a8._8_4_;
      iStack_2cc = local_3a8._12_4_;
      local_2e8 = auVar15._0_4_;
      iStack_2e4 = auVar15._4_4_;
      iStack_2e0 = auVar15._8_4_;
      iStack_2dc = auVar15._12_4_;
      local_3a8._4_4_ = iStack_2d4 + iStack_2e4;
      local_3a8._0_4_ = local_2d8 + local_2e8;
      local_3a8._8_4_ = iStack_2d0 + iStack_2e0;
      local_3a8._12_4_ = iStack_2cc + iStack_2dc;
    }
    local_380 = local_380 + (long)in_ESI * 2;
    local_388 = local_388 + (long)in_ECX * 2;
    local_390 = local_390 + (long)in_R9D * 2;
    data_l[1] = data_l[1] + (int)m_inv[0];
  }
  auVar15 = phaddd(local_3a8,local_3a8);
  auVar15 = phaddd(auVar15,auVar15);
  local_288 = auVar15._0_4_;
  return local_288;
}

Assistant:

static inline unsigned int highbd_masked_sad_ssse3(
    const uint8_t *src8, int src_stride, const uint8_t *a8, int a_stride,
    const uint8_t *b8, int b_stride, const uint8_t *m_ptr, int m_stride,
    int width, int height) {
  const uint16_t *src_ptr = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *a_ptr = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b_ptr = CONVERT_TO_SHORTPTR(b8);
  int x, y;
  __m128i res = _mm_setzero_si128();
  const __m128i mask_max = _mm_set1_epi16((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m128i round_const =
      _mm_set1_epi32((1 << AOM_BLEND_A64_ROUND_BITS) >> 1);
  const __m128i one = _mm_set1_epi16(1);

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x += 8) {
      const __m128i src = _mm_loadu_si128((const __m128i *)&src_ptr[x]);
      const __m128i a = _mm_loadu_si128((const __m128i *)&a_ptr[x]);
      const __m128i b = _mm_loadu_si128((const __m128i *)&b_ptr[x]);
      // Zero-extend mask to 16 bits
      const __m128i m = _mm_unpacklo_epi8(
          _mm_loadl_epi64((const __m128i *)&m_ptr[x]), _mm_setzero_si128());
      const __m128i m_inv = _mm_sub_epi16(mask_max, m);

      const __m128i data_l = _mm_unpacklo_epi16(a, b);
      const __m128i mask_l = _mm_unpacklo_epi16(m, m_inv);
      __m128i pred_l = _mm_madd_epi16(data_l, mask_l);
      pred_l = _mm_srai_epi32(_mm_add_epi32(pred_l, round_const),
                              AOM_BLEND_A64_ROUND_BITS);

      const __m128i data_r = _mm_unpackhi_epi16(a, b);
      const __m128i mask_r = _mm_unpackhi_epi16(m, m_inv);
      __m128i pred_r = _mm_madd_epi16(data_r, mask_r);
      pred_r = _mm_srai_epi32(_mm_add_epi32(pred_r, round_const),
                              AOM_BLEND_A64_ROUND_BITS);

      // Note: the maximum value in pred_l/r is (2^bd)-1 < 2^15,
      // so it is safe to do signed saturation here.
      const __m128i pred = _mm_packs_epi32(pred_l, pred_r);
      // There is no 16-bit SAD instruction, so we have to synthesize
      // an 8-element SAD. We do this by storing 4 32-bit partial SADs,
      // and accumulating them at the end
      const __m128i diff = _mm_abs_epi16(_mm_sub_epi16(pred, src));
      res = _mm_add_epi32(res, _mm_madd_epi16(diff, one));
    }

    src_ptr += src_stride;
    a_ptr += a_stride;
    b_ptr += b_stride;
    m_ptr += m_stride;
  }
  // At this point, we have four 32-bit partial SADs stored in 'res'.
  res = _mm_hadd_epi32(res, res);
  res = _mm_hadd_epi32(res, res);
  int sad = _mm_cvtsi128_si32(res);
  return sad;
}